

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

void helper_shilo_mips64(target_ulong ac,target_ulong rs,CPUMIPSState_conflict5 *env)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((rs & 0x3f) != 0) {
    bVar1 = (char)((char)rs << 2) >> 2;
    uVar2 = (ulong)(uint)(env->active_tc).LO[ac] | (env->active_tc).HI[ac] << 0x20;
    uVar3 = uVar2 << (-bVar1 & 0x3f);
    if ('\0' < (char)bVar1) {
      uVar3 = uVar2 >> (bVar1 & 0x3f);
    }
    (env->active_tc).HI[ac] = (long)uVar3 >> 0x20;
    (env->active_tc).LO[ac] = (long)(int)uVar3;
  }
  return;
}

Assistant:

void helper_shilo(target_ulong ac, target_ulong rs, CPUMIPSState *env)
{
    int8_t  rs5_0;
    uint64_t temp, acc;

    rs5_0 = rs & 0x3F;
    rs5_0 = (int8_t)(rs5_0 << 2) >> 2;

    if (unlikely(rs5_0 == 0)) {
        return;
    }

    acc   = (((uint64_t)env->active_tc.HI[ac] << 32) & MIPSDSP_LHI) |
            ((uint64_t)env->active_tc.LO[ac] & MIPSDSP_LLO);

    if (rs5_0 > 0) {
        temp = acc >> rs5_0;
    } else {
        temp = acc << -rs5_0;
    }

    env->active_tc.HI[ac] = (target_ulong)(int32_t)((temp & MIPSDSP_LHI) >> 32);
    env->active_tc.LO[ac] = (target_ulong)(int32_t)(temp & MIPSDSP_LLO);
}